

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef52::StdReverb_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *peVar1;
  uint in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  
  switch(in_ESI) {
  case 1:
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb density out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDI = in_XMM0_Da;
    break;
  case 2:
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb diffusion out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[1] = in_XMM0_Da;
    break;
  case 3:
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb gain out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[2] = in_XMM0_Da;
    break;
  case 4:
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb gainhf out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[3] = in_XMM0_Da;
    break;
  case 5:
    if ((in_XMM0_Da < 0.1) || (20.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb decay time out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[4] = in_XMM0_Da;
    break;
  case 6:
    if ((in_XMM0_Da < 0.1) || (2.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb decay hfratio out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[5] = in_XMM0_Da;
    break;
  case 7:
    if ((in_XMM0_Da < 0.0) || (3.16 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb reflections gain out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[6] = in_XMM0_Da;
    break;
  case 8:
    if ((in_XMM0_Da < 0.0) || (0.3 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb reflections delay out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[7] = in_XMM0_Da;
    break;
  case 9:
    if ((in_XMM0_Da < 0.0) || (10.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb late reverb gain out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[8] = in_XMM0_Da;
    break;
  case 10:
    if ((in_XMM0_Da < 0.0) || (0.1 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb late reverb delay out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[9] = in_XMM0_Da;
    break;
  case 0xb:
    if ((in_XMM0_Da < 0.892) || (1.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb air absorption gainhf out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[10] = in_XMM0_Da;
    break;
  case 0xc:
    if ((in_XMM0_Da < 0.0) || (10.0 < in_XMM0_Da)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception(peVar1,0xa003,"Reverb room rolloff factor out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    in_RDI[0xb] = in_XMM0_Da;
    break;
  default:
    peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (peVar1,0xa002,"Invalid reverb float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  return;
}

Assistant:

void StdReverb_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_REVERB_DENSITY:
        if(!(val >= AL_REVERB_MIN_DENSITY && val <= AL_REVERB_MAX_DENSITY))
            throw effect_exception{AL_INVALID_VALUE, "Reverb density out of range"};
        props->Reverb.Density = val;
        break;

    case AL_REVERB_DIFFUSION:
        if(!(val >= AL_REVERB_MIN_DIFFUSION && val <= AL_REVERB_MAX_DIFFUSION))
            throw effect_exception{AL_INVALID_VALUE, "Reverb diffusion out of range"};
        props->Reverb.Diffusion = val;
        break;

    case AL_REVERB_GAIN:
        if(!(val >= AL_REVERB_MIN_GAIN && val <= AL_REVERB_MAX_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Reverb gain out of range"};
        props->Reverb.Gain = val;
        break;

    case AL_REVERB_GAINHF:
        if(!(val >= AL_REVERB_MIN_GAINHF && val <= AL_REVERB_MAX_GAINHF))
            throw effect_exception{AL_INVALID_VALUE, "Reverb gainhf out of range"};
        props->Reverb.GainHF = val;
        break;

    case AL_REVERB_DECAY_TIME:
        if(!(val >= AL_REVERB_MIN_DECAY_TIME && val <= AL_REVERB_MAX_DECAY_TIME))
            throw effect_exception{AL_INVALID_VALUE, "Reverb decay time out of range"};
        props->Reverb.DecayTime = val;
        break;

    case AL_REVERB_DECAY_HFRATIO:
        if(!(val >= AL_REVERB_MIN_DECAY_HFRATIO && val <= AL_REVERB_MAX_DECAY_HFRATIO))
            throw effect_exception{AL_INVALID_VALUE, "Reverb decay hfratio out of range"};
        props->Reverb.DecayHFRatio = val;
        break;

    case AL_REVERB_REFLECTIONS_GAIN:
        if(!(val >= AL_REVERB_MIN_REFLECTIONS_GAIN && val <= AL_REVERB_MAX_REFLECTIONS_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Reverb reflections gain out of range"};
        props->Reverb.ReflectionsGain = val;
        break;

    case AL_REVERB_REFLECTIONS_DELAY:
        if(!(val >= AL_REVERB_MIN_REFLECTIONS_DELAY && val <= AL_REVERB_MAX_REFLECTIONS_DELAY))
            throw effect_exception{AL_INVALID_VALUE, "Reverb reflections delay out of range"};
        props->Reverb.ReflectionsDelay = val;
        break;

    case AL_REVERB_LATE_REVERB_GAIN:
        if(!(val >= AL_REVERB_MIN_LATE_REVERB_GAIN && val <= AL_REVERB_MAX_LATE_REVERB_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Reverb late reverb gain out of range"};
        props->Reverb.LateReverbGain = val;
        break;

    case AL_REVERB_LATE_REVERB_DELAY:
        if(!(val >= AL_REVERB_MIN_LATE_REVERB_DELAY && val <= AL_REVERB_MAX_LATE_REVERB_DELAY))
            throw effect_exception{AL_INVALID_VALUE, "Reverb late reverb delay out of range"};
        props->Reverb.LateReverbDelay = val;
        break;

    case AL_REVERB_AIR_ABSORPTION_GAINHF:
        if(!(val >= AL_REVERB_MIN_AIR_ABSORPTION_GAINHF && val <= AL_REVERB_MAX_AIR_ABSORPTION_GAINHF))
            throw effect_exception{AL_INVALID_VALUE, "Reverb air absorption gainhf out of range"};
        props->Reverb.AirAbsorptionGainHF = val;
        break;

    case AL_REVERB_ROOM_ROLLOFF_FACTOR:
        if(!(val >= AL_REVERB_MIN_ROOM_ROLLOFF_FACTOR && val <= AL_REVERB_MAX_ROOM_ROLLOFF_FACTOR))
            throw effect_exception{AL_INVALID_VALUE, "Reverb room rolloff factor out of range"};
        props->Reverb.RoomRolloffFactor = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid reverb float property 0x%04x", param};
    }
}